

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall
iDynTree::Model::getInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  pointer pLVar1;
  long lVar2;
  long lVar3;
  LinkIndex linkIdx;
  ulong uVar4;
  long lVar5;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_e8;
  Vector10 *local_d0 [2];
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
  local_c0;
  Vector10 inertiaParamsBuf;
  
  lVar2 = iDynTree::VectorDynSize::size();
  if (lVar2 != (((long)(this->links).
                       super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->links).
                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x70) * 10) {
    iDynTree::VectorDynSize::resize((ulong)modelInertialParams);
  }
  lVar5 = 0;
  lVar3 = 0;
  lVar2 = 0;
  uVar4 = 0;
  while( true ) {
    pLVar1 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->links).
                       super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pLVar1) / 0x70) <= uVar4) break;
    Link::inertia((Link *)((long)(pLVar1->m_inertia).m_mcom + lVar2 + 0xfffffffffffffff0U));
    iDynTree::SpatialInertia::asVector();
    local_d0[0] = &inertiaParamsBuf;
    toEigen(&local_e8,modelInertialParams);
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>,_0>
    .m_data = (PointerType)(local_e8._0_8_ + lVar5);
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .m_xpr._16_1_ = local_e8._16_1_;
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .m_xpr._0_8_ = local_e8._0_8_;
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .m_xpr._8_8_ = local_e8._8_8_;
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .m_outerStride = local_e8._8_8_;
    local_c0.
    super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
    .m_startRow.m_value = lVar3;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,10,1,false>,Eigen::Map<Eigen::Matrix<double,10,1,0,10,1>,0,Eigen::Stride<0,0>>>
              (&local_c0,
               (Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d0);
    uVar4 = uVar4 + 1;
    lVar2 = lVar2 + 0x70;
    lVar3 = lVar3 + 10;
    lVar5 = lVar5 + 0x50;
  }
  return true;
}

Assistant:

bool Model::getInertialParameters(VectorDynSize& modelInertialParams) const
{
    // Resize vector if necessary
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        modelInertialParams.resize(10*this->getNrOfLinks());
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf = links[linkIdx].inertia().asVector();

        toEigen(modelInertialParams).segment<10>(10*linkIdx) = toEigen(inertiaParamsBuf);
    }

    return true;
}